

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystem.cpp
# Opt level: O3

void __thiscall
solitaire::graphics::SDLGraphicsSystem::SDLGraphicsSystem
          (SDLGraphicsSystem *this,
          unique_ptr<solitaire::SDL::interfaces::Wrapper,_std::default_delete<solitaire::SDL::interfaces::Wrapper>_>
          *sdl)

{
  (this->super_GraphicsSystem)._vptr_GraphicsSystem = (_func_int **)&PTR__SDLGraphicsSystem_0032d8a8
  ;
  (this->sdl)._M_t.
  super___uniq_ptr_impl<solitaire::SDL::interfaces::Wrapper,_std::default_delete<solitaire::SDL::interfaces::Wrapper>_>
  ._M_t.
  super__Tuple_impl<0UL,_solitaire::SDL::interfaces::Wrapper_*,_std::default_delete<solitaire::SDL::interfaces::Wrapper>_>
  .super__Head_base<0UL,_solitaire::SDL::interfaces::Wrapper_*,_false>._M_head_impl =
       (sdl->_M_t).
       super___uniq_ptr_impl<solitaire::SDL::interfaces::Wrapper,_std::default_delete<solitaire::SDL::interfaces::Wrapper>_>
       ._M_t.
       super__Tuple_impl<0UL,_solitaire::SDL::interfaces::Wrapper_*,_std::default_delete<solitaire::SDL::interfaces::Wrapper>_>
       .super__Head_base<0UL,_solitaire::SDL::interfaces::Wrapper_*,_false>._M_head_impl;
  (sdl->_M_t).
  super___uniq_ptr_impl<solitaire::SDL::interfaces::Wrapper,_std::default_delete<solitaire::SDL::interfaces::Wrapper>_>
  ._M_t.
  super__Tuple_impl<0UL,_solitaire::SDL::interfaces::Wrapper_*,_std::default_delete<solitaire::SDL::interfaces::Wrapper>_>
  .super__Head_base<0UL,_solitaire::SDL::interfaces::Wrapper_*,_false>._M_head_impl = (Wrapper *)0x0
  ;
  *(undefined8 *)
   ((long)&(this->textures).
           super__Vector_base<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>,_std::allocator<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 2) = 0;
  *(undefined8 *)
   ((long)&(this->textures).
           super__Vector_base<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>,_std::allocator<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 2) = 0;
  (this->textures).
  super__Vector_base<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>,_std::allocator<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->textures).
  super__Vector_base<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>,_std::allocator<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(_Invoker_type *)
   ((long)&(this->renderer)._M_t.
           super___uniq_ptr_impl<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>._M_t.
           super__Tuple_impl<0UL,_SDL_Renderer_*,_std::function<void_(SDL_Renderer_*)>_>.
           super__Tuple_impl<1UL,_std::function<void_(SDL_Renderer_*)>_>.
           super__Head_base<1UL,_std::function<void_(SDL_Renderer_*)>,_false> + 0x18) =
       (_Invoker_type)0x0;
  (this->renderer)._M_t.super___uniq_ptr_impl<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>.
  _M_t.super__Tuple_impl<0UL,_SDL_Renderer_*,_std::function<void_(SDL_Renderer_*)>_>.
  super__Head_base<0UL,_SDL_Renderer_*,_false>._M_head_impl = (SDL_Renderer_conflict *)0x0;
  *(undefined8 *)
   ((long)&(this->renderer)._M_t.
           super___uniq_ptr_impl<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>._M_t.
           super__Tuple_impl<0UL,_SDL_Renderer_*,_std::function<void_(SDL_Renderer_*)>_>.
           super__Tuple_impl<1UL,_std::function<void_(SDL_Renderer_*)>_>.
           super__Head_base<1UL,_std::function<void_(SDL_Renderer_*)>,_false> + 8) = 0;
  *(_Manager_type *)
   ((long)&(this->renderer)._M_t.
           super___uniq_ptr_impl<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>._M_t.
           super__Tuple_impl<0UL,_SDL_Renderer_*,_std::function<void_(SDL_Renderer_*)>_>.
           super__Tuple_impl<1UL,_std::function<void_(SDL_Renderer_*)>_>.
           super__Head_base<1UL,_std::function<void_(SDL_Renderer_*)>,_false> + 0x10) =
       (_Manager_type)0x0;
  (this->window)._M_t.super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
  super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_>.
  super__Head_base<0UL,_SDL_Window_*,_false>._M_head_impl = (SDL_Window_conflict *)0x0;
  *(undefined8 *)
   &(this->renderer)._M_t.super___uniq_ptr_impl<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>
    ._M_t.super__Tuple_impl<0UL,_SDL_Renderer_*,_std::function<void_(SDL_Renderer_*)>_>.
    super__Tuple_impl<1UL,_std::function<void_(SDL_Renderer_*)>_>.
    super__Head_base<1UL,_std::function<void_(SDL_Renderer_*)>,_false>._M_head_impl = 0;
  *(_Manager_type *)
   ((long)&(this->window)._M_t.
           super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
           super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_>.
           super__Tuple_impl<1UL,_std::function<void_(SDL_Window_*)>_>.
           super__Head_base<1UL,_std::function<void_(SDL_Window_*)>,_false> + 0x10) =
       (_Manager_type)0x0;
  *(_Invoker_type *)
   ((long)&(this->window)._M_t.
           super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
           super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_>.
           super__Tuple_impl<1UL,_std::function<void_(SDL_Window_*)>_>.
           super__Head_base<1UL,_std::function<void_(SDL_Window_*)>,_false> + 0x18) =
       (_Invoker_type)0x0;
  *(undefined8 *)
   &(this->window)._M_t.super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
    super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_>.
    super__Tuple_impl<1UL,_std::function<void_(SDL_Window_*)>_>.
    super__Head_base<1UL,_std::function<void_(SDL_Window_*)>,_false>._M_head_impl = 0;
  *(undefined8 *)
   ((long)&(this->window)._M_t.
           super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
           super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_>.
           super__Tuple_impl<1UL,_std::function<void_(SDL_Window_*)>_>.
           super__Head_base<1UL,_std::function<void_(SDL_Window_*)>,_false> + 8) = 0;
  return;
}

Assistant:

SDLGraphicsSystem::SDLGraphicsSystem(std::unique_ptr<SDL::interfaces::Wrapper> sdl):
    sdl {std::move(sdl)} {
}